

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void shift_reg(DisasContext_conflict2 *s,uint16_t insn,int opsize)

{
  int32_t arg2;
  TCGContext_conflict2 *s_00;
  uint uVar1;
  TCGv_i32 arg;
  TCGTemp *a1;
  TCGTemp *a3;
  TCGTemp *pTVar2;
  TCGv_i32 c2;
  TCGv_i64 c2_00;
  uintptr_t o_3;
  uintptr_t o;
  TCGv_i64 ret;
  uintptr_t o_4;
  TCGv_i32 ret_00;
  TCGv_i64 ret_01;
  
  s_00 = s->uc->tcg_ctx;
  arg2 = *(int32_t *)(&DAT_00d7e48c + (long)opsize * 4);
  uVar1 = insn & 7;
  arg = gen_extend(s,s_00->cpu_dregs[uVar1],opsize,(insn & 8) >> 3 ^ 1);
  a1 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I64,false);
  ret_01 = (TCGv_i64)((long)a1 - (long)s_00);
  a3 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)a3 - (long)s_00);
  pTVar2 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
  ret_00 = (TCGv_i32)((long)pTVar2 - (long)s_00);
  tcg_gen_andi_i32_m68k
            (s_00,ret_00,*(TCGv_i32 *)((long)s_00->cpu_dregs + (ulong)(insn >> 6 & 0x38)),0x3f);
  tcg_gen_extu_i32_i64_m68k(s_00,ret,ret_00);
  tcg_gen_extu_i32_i64_m68k(s_00,ret_01,arg);
  tcg_gen_op2_m68k(s_00,INDEX_op_movi_i32,(TCGArg)(QREG_CC_V + (long)s_00),0);
  if ((insn >> 8 & 1) == 0) {
    tcg_gen_shli_i64_m68k(s_00,ret_01,ret_01,0x20);
    tcg_gen_op3_m68k(s_00,((insn & 8) == 0) + INDEX_op_shr_i64,(TCGArg)a1,(TCGArg)a1,(TCGArg)a3);
    tcg_gen_extr_i64_i32_m68k(s_00,QREG_CC_C,QREG_CC_N,ret_01);
    tcg_gen_shri_i32_m68k(s_00,QREG_CC_C,QREG_CC_C,0x1f);
    tcg_gen_movcond_i32_m68k(s_00,TCG_COND_NE,QREG_CC_X,ret_00,QREG_CC_V,QREG_CC_C,QREG_CC_X);
  }
  else {
    tcg_gen_op3_m68k(s_00,INDEX_op_shl_i64,(TCGArg)a1,(TCGArg)a1,(TCGArg)a3);
    if (opsize == 2) {
      tcg_gen_extr_i64_i32_m68k(s_00,QREG_CC_N,QREG_CC_C,ret_01);
    }
    else {
      c2 = tcg_const_i32_m68k(s_00,0);
      tcg_gen_extrl_i64_i32_m68k(s_00,QREG_CC_N,ret_01);
      tcg_gen_shri_i32_m68k(s_00,QREG_CC_C,QREG_CC_N,arg2);
      tcg_gen_movcond_i32_m68k(s_00,TCG_COND_EQ,QREG_CC_C,ret_00,c2,c2,QREG_CC_C);
      tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(c2 + (long)s_00));
    }
    tcg_gen_andi_i32_m68k(s_00,QREG_CC_C,QREG_CC_C,1);
    tcg_gen_movcond_i32_m68k(s_00,TCG_COND_NE,QREG_CC_X,ret_00,QREG_CC_V,QREG_CC_C,QREG_CC_X);
    if (((insn & 8) == 0) && ((s->env->features & 1) != 0)) {
      c2_00 = tcg_const_i64_m68k(s_00,0x20);
      tcg_gen_movcond_i64_m68k(s_00,TCG_COND_GT,ret,ret,c2_00,c2_00,ret);
      tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(c2_00 + (long)s_00));
      tcg_gen_ext_i32_i64_m68k(s_00,ret_01,arg);
      tcg_gen_op3_m68k(s_00,INDEX_op_shl_i64,(TCGArg)a3,(TCGArg)a1,(TCGArg)a3);
      tcg_gen_op3_m68k(s_00,INDEX_op_xor_i64,(TCGArg)a1,(TCGArg)a1,(TCGArg)a3);
      tcg_gen_andi_i64_m68k(s_00,ret_01,ret_01,-1L << ((char)arg2 - 1U & 0x3f));
      tcg_gen_setcondi_i64_m68k(s_00,TCG_COND_NE,ret_01,ret_01,0);
      tcg_gen_extrl_i64_i32_m68k(s_00,QREG_CC_V,ret_01);
      tcg_gen_op2_m68k(s_00,INDEX_op_neg_i32,(TCGArg)(QREG_CC_V + (long)s_00),
                       (TCGArg)(QREG_CC_V + (long)s_00));
    }
  }
  if (opsize != 2) {
    if (opsize == 1) {
      tcg_gen_ext16s_i32_m68k(s_00,QREG_CC_N,QREG_CC_N);
    }
    else {
      if (opsize != 0) {
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/m68k/translate.c"
                   ,0x24c,(char *)0x0);
      }
      tcg_gen_ext8s_i32_m68k(s_00,QREG_CC_N,QREG_CC_N);
    }
  }
  if (QREG_CC_Z != QREG_CC_N) {
    tcg_gen_op2_m68k(s_00,INDEX_op_mov_i32,(TCGArg)(QREG_CC_Z + (long)s_00),
                     (TCGArg)(QREG_CC_N + (long)s_00));
  }
  tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(ret_00 + (long)s_00));
  tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(ret + (long)s_00));
  tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(ret_01 + (long)s_00));
  gen_partset_reg(s_00,opsize,s_00->cpu_dregs[uVar1],QREG_CC_N);
  set_cc_op(s,CC_OP_FLAGS);
  return;
}

Assistant:

static inline void shift_reg(DisasContext *s, uint16_t insn, int opsize)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int logical = insn & 8;
    int left = insn & 0x100;
    int bits = opsize_bytes(opsize) * 8;
    TCGv reg = gen_extend(s, DREG(insn, 0), opsize, !logical);
    TCGv s32;
    TCGv_i64 t64, s64;

    t64 = tcg_temp_new_i64(tcg_ctx);
    s64 = tcg_temp_new_i64(tcg_ctx);
    s32 = tcg_temp_new(tcg_ctx);

    /*
     * Note that m68k truncates the shift count modulo 64, not 32.
     * In addition, a 64-bit shift makes it easy to find "the last
     * bit shifted out", for the carry flag.
     */
    tcg_gen_andi_i32(tcg_ctx, s32, DREG(insn, 9), 63);
    tcg_gen_extu_i32_i64(tcg_ctx, s64, s32);
    tcg_gen_extu_i32_i64(tcg_ctx, t64, reg);

    /* Optimistically set V=0.  Also used as a zero source below.  */
    tcg_gen_movi_i32(tcg_ctx, QREG_CC_V, 0);
    if (left) {
        tcg_gen_shl_i64(tcg_ctx, t64, t64, s64);

        if (opsize == OS_LONG) {
            tcg_gen_extr_i64_i32(tcg_ctx, QREG_CC_N, QREG_CC_C, t64);
            /* Note that C=0 if shift count is 0, and we get that for free.  */
        } else {
            TCGv zero = tcg_const_i32(tcg_ctx, 0);
            tcg_gen_extrl_i64_i32(tcg_ctx, QREG_CC_N, t64);
            tcg_gen_shri_i32(tcg_ctx, QREG_CC_C, QREG_CC_N, bits);
            tcg_gen_movcond_i32(tcg_ctx, TCG_COND_EQ, QREG_CC_C,
                                s32, zero, zero, QREG_CC_C);
            tcg_temp_free(tcg_ctx, zero);
        }
        tcg_gen_andi_i32(tcg_ctx, QREG_CC_C, QREG_CC_C, 1);

        /* X = C, but only if the shift count was non-zero.  */
        tcg_gen_movcond_i32(tcg_ctx, TCG_COND_NE, QREG_CC_X, s32, QREG_CC_V,
                            QREG_CC_C, QREG_CC_X);

        /*
         * M68000 sets V if the most significant bit is changed at
         * any time during the shift operation.  Do this via creating
         * an extension of the sign bit, comparing, and discarding
         * the bits below the sign bit.  I.e.
         *     int64_t s = (intN_t)reg;
         *     int64_t t = (int64_t)(intN_t)reg << count;
         *     V = ((s ^ t) & (-1 << (bits - 1))) != 0
         */
        if (!logical && m68k_feature(s->env, M68K_FEATURE_M68000)) {
            TCGv_i64 tt = tcg_const_i64(tcg_ctx, 32);
            /* if shift is greater than 32, use 32 */
            tcg_gen_movcond_i64(tcg_ctx, TCG_COND_GT, s64, s64, tt, tt, s64);
            tcg_temp_free_i64(tcg_ctx, tt);
            /* Sign extend the input to 64 bits; re-do the shift.  */
            tcg_gen_ext_i32_i64(tcg_ctx, t64, reg);
            tcg_gen_shl_i64(tcg_ctx, s64, t64, s64);
            /* Clear all bits that are unchanged.  */
            tcg_gen_xor_i64(tcg_ctx, t64, t64, s64);
            /* Ignore the bits below the sign bit.  */
#ifdef _MSC_VER
            tcg_gen_andi_i64(tcg_ctx, t64, t64, 0xffffffffffffffffULL << (bits - 1));
#else
            tcg_gen_andi_i64(tcg_ctx, t64, t64, -1ULL << (bits - 1));
#endif
            /* If any bits remain set, we have overflow.  */
            tcg_gen_setcondi_i64(tcg_ctx, TCG_COND_NE, t64, t64, 0);
            tcg_gen_extrl_i64_i32(tcg_ctx, QREG_CC_V, t64);
            tcg_gen_neg_i32(tcg_ctx, QREG_CC_V, QREG_CC_V);
        }
    } else {
        tcg_gen_shli_i64(tcg_ctx, t64, t64, 32);
        if (logical) {
            tcg_gen_shr_i64(tcg_ctx, t64, t64, s64);
        } else {
            tcg_gen_sar_i64(tcg_ctx, t64, t64, s64);
        }
        tcg_gen_extr_i64_i32(tcg_ctx, QREG_CC_C, QREG_CC_N, t64);

        /* Note that C=0 if shift count is 0, and we get that for free.  */
        tcg_gen_shri_i32(tcg_ctx, QREG_CC_C, QREG_CC_C, 31);

        /* X = C, but only if the shift count was non-zero.  */
        tcg_gen_movcond_i32(tcg_ctx, TCG_COND_NE, QREG_CC_X, s32, QREG_CC_V,
                            QREG_CC_C, QREG_CC_X);
    }
    gen_ext(tcg_ctx, QREG_CC_N, QREG_CC_N, opsize, 1);
    tcg_gen_mov_i32(tcg_ctx, QREG_CC_Z, QREG_CC_N);

    tcg_temp_free(tcg_ctx, s32);
    tcg_temp_free_i64(tcg_ctx, s64);
    tcg_temp_free_i64(tcg_ctx, t64);

    /* Write back the result.  */
    gen_partset_reg(tcg_ctx, opsize, DREG(insn, 0), QREG_CC_N);
    set_cc_op(s, CC_OP_FLAGS);
}